

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::find_or_prepare_insert_non_soo<std::__cxx11::string>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  ulong uVar1;
  size_t __n;
  uint uVar2;
  ushort uVar3;
  ctrl_t cVar4;
  ctrl_t cVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  undefined4 uVar16;
  undefined1 uVar17;
  bool bVar18;
  ushort uVar19;
  int iVar20;
  uint64_t uVar21;
  ctrl_t *pcVar22;
  slot_type *psVar23;
  ctrl_t *pcVar24;
  size_t sVar25;
  size_t cap;
  PolicyFunctions *in_R9;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  CommonFields *common;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  iterator iVar36;
  FindInfo target;
  __m128i match;
  anon_union_8_1_a8a14541_for_iterator_2 local_88;
  ctrl_t *local_80;
  ulong local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  ctrl_t cVar29;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  
  if (*(long *)this == 1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf66,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>, K = std::basic_string<char>]"
                 );
  }
  if (*(long *)this == 0) {
LAB_00193e0e:
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>]"
                 );
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)this);
  uVar26 = key->_M_string_length;
  uVar21 = hash_internal::MixingHashState::CombineContiguousImpl
                     (&hash_internal::MixingHashState::kSeed,(key->_M_dataplus)._M_p,uVar26);
  uVar1 = *(ulong *)this;
  if ((uVar1 + 1 & uVar1) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar28 = (uVar21 ^ uVar26) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 | (uVar28 & 0xff0000000000) >> 0x18
            | (uVar28 & 0xff00000000) >> 8 | (uVar28 & 0xff000000) << 8 |
            (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
  uVar26 = ((ulong)common >> 7 ^ *(ulong *)(this + 0x10) >> 0xc) & uVar1;
  pcVar22 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)this);
  uVar17 = (undefined1)(uVar28 >> 0x38);
  auVar30 = ZEXT216(CONCAT11(uVar17,uVar17) & 0x7f7f);
  auVar30 = pshuflw(auVar30,auVar30,0);
  iVar36 = __return_storage_ptr__->first;
  bVar18 = __return_storage_ptr__->second;
  local_68 = 0;
  do {
    pcVar24 = pcVar22 + uVar26;
    uVar16 = *(undefined4 *)pcVar24;
    cVar4 = pcVar24[4];
    cVar5 = pcVar24[5];
    cVar6 = pcVar24[6];
    cVar7 = pcVar24[7];
    cVar8 = pcVar24[8];
    cVar9 = pcVar24[9];
    cVar10 = pcVar24[10];
    cVar11 = pcVar24[0xb];
    cVar12 = pcVar24[0xc];
    cVar13 = pcVar24[0xd];
    cVar14 = pcVar24[0xe];
    cVar15 = pcVar24[0xf];
    cVar29 = auVar30[0];
    auVar31[0] = -(cVar29 == *pcVar24);
    cVar33 = auVar30[1];
    auVar31[1] = -(cVar33 == pcVar24[1]);
    cVar34 = auVar30[2];
    auVar31[2] = -(cVar34 == pcVar24[2]);
    cVar35 = auVar30[3];
    auVar31[3] = -(cVar35 == pcVar24[3]);
    auVar31[4] = -(cVar29 == cVar4);
    auVar31[5] = -(cVar33 == cVar5);
    auVar31[6] = -(cVar34 == cVar6);
    auVar31[7] = -(cVar35 == cVar7);
    auVar31[8] = -(cVar29 == cVar8);
    auVar31[9] = -(cVar33 == cVar9);
    auVar31[10] = -(cVar34 == cVar10);
    auVar31[0xb] = -(cVar35 == cVar11);
    auVar31[0xc] = -(cVar29 == cVar12);
    auVar31[0xd] = -(cVar33 == cVar13);
    auVar31[0xe] = -(cVar34 == cVar14);
    auVar31[0xf] = -(cVar35 == cVar15);
    uVar19 = (ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf;
    uVar27 = (uint)uVar19;
    local_80 = iVar36.ctrl_;
    local_88 = iVar36.field_1;
    while (uVar19 != 0) {
      uVar2 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      psVar23 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)this);
      uVar28 = uVar2 + uVar26 & uVar1;
      __n = psVar23[uVar28]._M_len;
      if ((__n == key->_M_string_length) &&
         ((__n == 0 ||
          (iVar20 = bcmp(psVar23[uVar28]._M_str,(key->_M_dataplus)._M_p,__n), iVar20 == 0)))) {
        (__return_storage_ptr__->first).field_1 = local_88;
        __return_storage_ptr__->second = bVar18;
        (__return_storage_ptr__->first).ctrl_ = local_80;
        iVar36 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)this,uVar28);
        __return_storage_ptr__->first = iVar36;
        __return_storage_ptr__->second = false;
        return __return_storage_ptr__;
      }
      uVar19 = (ushort)(uVar27 - 1) & (ushort)uVar27;
      uVar27 = CONCAT22((short)(uVar27 - 1 >> 0x10),uVar19);
    }
    local_58 = (char)uVar16;
    cStack_57 = (char)((uint)uVar16 >> 8);
    cStack_56 = (char)((uint)uVar16 >> 0x10);
    cStack_55 = (char)((uint)uVar16 >> 0x18);
    auVar32[0] = -(local_58 == -0x80);
    auVar32[1] = -(cStack_57 == -0x80);
    auVar32[2] = -(cStack_56 == -0x80);
    auVar32[3] = -(cStack_55 == -0x80);
    auVar32[4] = -(cVar4 == kEmpty);
    auVar32[5] = -(cVar5 == kEmpty);
    auVar32[6] = -(cVar6 == kEmpty);
    auVar32[7] = -(cVar7 == kEmpty);
    auVar32[8] = -(cVar8 == kEmpty);
    auVar32[9] = -(cVar9 == kEmpty);
    auVar32[10] = -(cVar10 == kEmpty);
    auVar32[0xb] = -(cVar11 == kEmpty);
    auVar32[0xc] = -(cVar12 == kEmpty);
    auVar32[0xd] = -(cVar13 == kEmpty);
    auVar32[0xe] = -(cVar14 == kEmpty);
    auVar32[0xf] = -(cVar15 == kEmpty);
    uVar19 = (ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf;
    sVar25 = *(size_t *)this;
    if (uVar19 == 0) {
      if (sVar25 == 0) goto LAB_00193df6;
      if (sVar25 < local_68 + 0x10) {
        (__return_storage_ptr__->first).field_1 = local_88;
        __return_storage_ptr__->second = bVar18;
        (__return_storage_ptr__->first).ctrl_ = local_80;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>, K = std::basic_string<char>]"
                     );
      }
      uVar26 = uVar26 + local_68 + 0x10 & uVar1;
      local_68 = local_68 + 0x10;
    }
    else {
      if (sVar25 == 0) {
LAB_00193df6:
        (__return_storage_ptr__->first).field_1 = local_88;
        __return_storage_ptr__->second = bVar18;
        (__return_storage_ptr__->first).ctrl_ = local_80;
        goto LAB_00193e0e;
      }
      pcVar24 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)this);
      bVar18 = ShouldInsertBackwardsForDebug(sVar25,(size_t)common,pcVar24);
      if (bVar18) {
        uVar3 = 0xf;
        if (uVar19 != 0) {
          for (; uVar19 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar27 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar27 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_68;
      sVar25 = PrepareInsertNonSoo((container_internal *)this,common,uVar27 + uVar26 & uVar1,target,
                                   in_R9);
      iVar36 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)this,sVar25);
      bVar18 = true;
    }
    if (uVar19 != 0) {
      (__return_storage_ptr__->first).field_1 = iVar36.field_1;
      __return_storage_ptr__->second = bVar18;
      (__return_storage_ptr__->first).ctrl_ = iVar36.ctrl_;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }